

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall HEkkDualRHS::updateInfeasList(HEkkDualRHS *this,HVector *column)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  HEkk *pHVar6;
  pointer pcVar7;
  ulong uVar8;
  
  if (this->workCount < 0) {
    return;
  }
  uVar2 = column->count;
  piVar5 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x4b,0);
  if (this->workCutoff <= 0.0) {
    if (0 < (int)uVar2) {
      uVar8 = 0;
      do {
        iVar3 = piVar5[uVar8];
        pcVar7 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pcVar7[iVar3] == '\0') &&
           ((dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar3], dVar1 != 0.0 || (NAN(dVar1))))
           ) {
          iVar4 = this->workCount;
          this->workCount = iVar4 + 1;
          (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4] = iVar3;
          pcVar7[iVar3] = '\x01';
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  else if (0 < (int)uVar2) {
    pHVar6 = this->ekk_instance_;
    uVar8 = 0;
    do {
      iVar3 = piVar5[uVar8];
      pcVar7 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pcVar7[iVar3] == '\0') &&
         ((pHVar6->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3] * this->workCutoff <
          (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3])) {
        iVar4 = this->workCount;
        this->workCount = iVar4 + 1;
        (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = iVar3;
        pcVar7[iVar3] = '\x01';
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x4b,0);
  return;
}

Assistant:

void HEkkDualRHS::updateInfeasList(HVector* column) {
  const HighsInt columnCount = column->count;
  const HighsInt* variable_index = column->index.data();

  // DENSE mode: disabled
  if (workCount < 0) return;

  analysis->simplexTimerStart(UpdatePrimalClock);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCutoff <= 0) {
    // The regular sparse way
    for (HighsInt i = 0; i < columnCount; i++) {
      HighsInt iRow = variable_index[i];
      if (workMark[iRow] == 0) {
        if (work_infeasibility[iRow]) {
          workIndex[workCount++] = iRow;
          workMark[iRow] = 1;
        }
      }
    }
  } else {
    // The hyper sparse way
    for (HighsInt i = 0; i < columnCount; i++) {
      HighsInt iRow = variable_index[i];
      if (workMark[iRow] == 0) {
        if (work_infeasibility[iRow] > edge_weight[iRow] * workCutoff) {
          workIndex[workCount++] = iRow;
          workMark[iRow] = 1;
        }
      }
    }
  }

  analysis->simplexTimerStop(UpdatePrimalClock);
}